

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O0

void __thiscall
FxFRandom::FxFRandom
          (FxFRandom *this,FRandom *r,FxExpression *mi,FxExpression *ma,FScriptPosition *pos)

{
  FxFloatCast *pFVar1;
  FScriptPosition *pos_local;
  FxExpression *ma_local;
  FxExpression *mi_local;
  FRandom *r_local;
  FxFRandom *this_local;
  
  FxRandom::FxRandom(&this->super_FxRandom,r,(FxExpression *)0x0,(FxExpression *)0x0,pos);
  (this->super_FxRandom).super_FxExpression._vptr_FxExpression =
       (_func_int **)&PTR__FxFRandom_00b89f48;
  if ((mi != (FxExpression *)0x0) && (ma != (FxExpression *)0x0)) {
    pFVar1 = (FxFloatCast *)operator_new(0x40);
    FxFloatCast::FxFloatCast(pFVar1,mi);
    (this->super_FxRandom).min = (FxExpression *)pFVar1;
    pFVar1 = (FxFloatCast *)operator_new(0x40);
    FxFloatCast::FxFloatCast(pFVar1,ma);
    (this->super_FxRandom).max = (FxExpression *)pFVar1;
  }
  (this->super_FxRandom).super_FxExpression.ValueType = (PType *)TypeFloat64;
  return;
}

Assistant:

FxFRandom::FxFRandom(FRandom *r, FxExpression *mi, FxExpression *ma, const FScriptPosition &pos)
: FxRandom(r, NULL, NULL, pos)
{
	if (mi != NULL && ma != NULL)
	{
		min = new FxFloatCast(mi);
		max = new FxFloatCast(ma);
	}
	ValueType = TypeFloat64;
}